

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationBuilder::addOnlyClosure
          (CollationBuilder *this,UnicodeString *nfdPrefix,UnicodeString *nfdString,int64_t *newCEs,
          int32_t newCEsLength,uint32_t ce32,UErrorCode *errorCode)

{
  UBool UVar1;
  UBool UVar2;
  UnicodeString prefix;
  UnicodeString str;
  CanonicalIterator stringIter;
  CanonicalIterator prefixIter;
  UnicodeString local_240;
  UnicodeString local_200;
  undefined1 local_1c0 [200];
  CanonicalIterator local_f8;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((ushort)(nfdPrefix->fUnion).fStackFields.fLengthAndFlags < 0x20) {
      CanonicalIterator::CanonicalIterator(&local_f8,nfdString,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        local_1c0._0_8_ = &PTR__UnicodeString_003d8fe8;
        local_1c0._8_2_ = 2;
        while ((CanonicalIterator::next(&local_240,&local_f8),
               (local_240.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1) == 0 &&
               (((UVar1 = ignoreString(this,&local_240,errorCode), UVar1 != '\0' ||
                 (UVar1 = UnicodeString::operator==(&local_240,nfdString), UVar1 != '\0')) ||
                (ce32 = addIfDifferent(this,(UnicodeString *)local_1c0,&local_240,newCEs,
                                       newCEsLength,ce32,errorCode),
                *errorCode < U_ILLEGAL_ARGUMENT_ERROR))))) {
          UnicodeString::~UnicodeString(&local_240);
        }
        UnicodeString::~UnicodeString(&local_240);
        UnicodeString::~UnicodeString((UnicodeString *)local_1c0);
      }
      CanonicalIterator::~CanonicalIterator(&local_f8);
    }
    else {
      CanonicalIterator::CanonicalIterator(&local_f8,nfdPrefix,errorCode);
      CanonicalIterator::CanonicalIterator((CanonicalIterator *)local_1c0,nfdString,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        while( true ) {
          CanonicalIterator::next(&local_240,&local_f8);
          if ((local_240.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1) != 0) break;
          UVar1 = ignorePrefix(this,&local_240,errorCode);
          if (UVar1 == '\0') {
            UVar1 = UnicodeString::operator==(&local_240,nfdPrefix);
            while (CanonicalIterator::next(&local_200,(CanonicalIterator *)local_1c0),
                  (local_200.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1) == 0) {
              UVar2 = ignoreString(this,&local_200,errorCode);
              if (((UVar2 == '\0') &&
                  ((UVar1 == '\0' ||
                   (UVar2 = UnicodeString::operator==(&local_200,nfdString), UVar2 == '\0')))) &&
                 (ce32 = addIfDifferent(this,&local_240,&local_200,newCEs,newCEsLength,ce32,
                                        errorCode), U_ZERO_ERROR < *errorCode)) {
                UnicodeString::~UnicodeString(&local_200);
                UnicodeString::~UnicodeString(&local_240);
                goto LAB_0022fe87;
              }
              UnicodeString::~UnicodeString(&local_200);
            }
            UnicodeString::~UnicodeString(&local_200);
            CanonicalIterator::reset((CanonicalIterator *)local_1c0);
          }
          UnicodeString::~UnicodeString(&local_240);
        }
        UnicodeString::~UnicodeString(&local_240);
      }
LAB_0022fe87:
      CanonicalIterator::~CanonicalIterator((CanonicalIterator *)local_1c0);
      CanonicalIterator::~CanonicalIterator(&local_f8);
    }
  }
  return ce32;
}

Assistant:

uint32_t
CollationBuilder::addOnlyClosure(const UnicodeString &nfdPrefix, const UnicodeString &nfdString,
                                 const int64_t newCEs[], int32_t newCEsLength, uint32_t ce32,
                                 UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return ce32; }

    // Map from canonically equivalent input to the CEs. (But not from the all-NFD input.)
    if(nfdPrefix.isEmpty()) {
        CanonicalIterator stringIter(nfdString, errorCode);
        if(U_FAILURE(errorCode)) { return ce32; }
        UnicodeString prefix;
        for(;;) {
            UnicodeString str = stringIter.next();
            if(str.isBogus()) { break; }
            if(ignoreString(str, errorCode) || str == nfdString) { continue; }
            ce32 = addIfDifferent(prefix, str, newCEs, newCEsLength, ce32, errorCode);
            if(U_FAILURE(errorCode)) { return ce32; }
        }
    } else {
        CanonicalIterator prefixIter(nfdPrefix, errorCode);
        CanonicalIterator stringIter(nfdString, errorCode);
        if(U_FAILURE(errorCode)) { return ce32; }
        for(;;) {
            UnicodeString prefix = prefixIter.next();
            if(prefix.isBogus()) { break; }
            if(ignorePrefix(prefix, errorCode)) { continue; }
            UBool samePrefix = prefix == nfdPrefix;
            for(;;) {
                UnicodeString str = stringIter.next();
                if(str.isBogus()) { break; }
                if(ignoreString(str, errorCode) || (samePrefix && str == nfdString)) { continue; }
                ce32 = addIfDifferent(prefix, str, newCEs, newCEsLength, ce32, errorCode);
                if(U_FAILURE(errorCode)) { return ce32; }
            }
            stringIter.reset();
        }
    }
    return ce32;
}